

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

SearchStatus __thiscall tsbp::LeftmostActiveOnly::SolveParallelNative(LeftmostActiveOnly *this)

{
  anon_class_72_9_aa08f9ab_for___f __f;
  SearchStatus SVar1;
  bool bVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  __i;
  size_type __n;
  reference piVar3;
  pointer pLVar4;
  iterator __first;
  iterator __last;
  ostream *poVar5;
  rep rVar6;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_230;
  duration<long,_std::ratio<1L,_1000000000L>_> local_228;
  duration<long,_std::ratio<1L,_1L>_> local_220;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_218;
  duration<long,_std::ratio<1L,_1000000000L>_> local_210;
  duration<long,_std::ratio<1L,_1L>_> local_208;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_200;
  time_point endParallelFor;
  undefined1 local_198 [8];
  mutex mutex;
  Packing2D solution;
  __atomic_base<long> _Stack_c8;
  atomic<bool> isFeasible;
  atomic<long> exploredNodes;
  atomic<unsigned_long> exploredSubtrees;
  SearchStatus status;
  undefined1 local_a8 [8];
  unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_> lmao;
  size_t itemId;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined1 local_70 [8];
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  subtrees;
  atomic<bool> feasibleSolutionCancellationToken;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_48;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  endLast;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_38;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  begin;
  LeftmostActiveOnly *this_local;
  memory_order __b;
  
  begin._M_i.__d.__r =
       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        )(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          )this;
  endLast._M_i.__d.__r =
       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        )std::chrono::_V2::steady_clock::now();
  std::
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::atomic(&local_38,endLast._M_i);
  __i = std::
        atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
        ::load(&local_38,seq_cst);
  std::
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::atomic(&local_48,__i);
  std::atomic<bool>::atomic
            ((atomic<bool> *)
             ((long)&subtrees.
                     super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),false);
  std::
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ::vector((vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
            *)local_70);
  __n = CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
  std::
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ::reserve((vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
             *)local_70,__n);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->branchingOrder);
  itemId = (size_t)std::vector<int,_std::allocator<int>_>::end(&this->branchingOrder);
  while (bVar2 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&itemId), ((bVar2 ^ 0xffU) & 1) != 0) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    lmao._M_t.
    super___uniq_ptr_impl<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>.
    _M_t.
    super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
    .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl =
         (__uniq_ptr_data<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>,_true,_true>
          )(long)*piVar3;
    std::make_unique<tsbp::LeftmostActiveOnly,tsbp::InputParameters&>((InputParameters *)local_a8);
    pLVar4 = std::
             unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>::
             operator->((unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                         *)local_a8);
    AddContainer(pLVar4,&this->container);
    pLVar4 = std::
             unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>::
             operator->((unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                         *)local_a8);
    std::optional<int>::optional<unsigned_long_&,_true>
              ((optional<int> *)&stack0xffffffffffffff50,(unsigned_long *)&lmao);
    AddItems(pLVar4,&this->items,(optional<int> *)&stack0xffffffffffffff50,
             &this->fixedItemCoordinatesX);
    pLVar4 = std::
             unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>::
             operator->((unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                         *)local_a8);
    SetBranchingOrder(pLVar4,&this->branchingOrder);
    pLVar4 = std::
             unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>::
             operator->((unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                         *)local_a8);
    AddCancellationToken
              (pLVar4,(atomic<bool> *)
                      ((long)&subtrees.
                              super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
    ::push_back((vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
                 *)local_70,(value_type *)local_a8);
    std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>::
    ~unique_ptr((unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                 *)local_a8);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  exploredSubtrees.super___atomic_base<unsigned_long>._M_i._4_4_ = None;
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)&exploredNodes,0);
  std::atomic<long>::atomic((atomic<long> *)&stack0xffffffffffffff38,0);
  std::atomic<bool>::atomic((atomic<bool> *)&solution.field_0x9f,false);
  Packing2D::Packing2D((Packing2D *)&mutex.super___mutex_base._M_mutex.__data.__list.__next);
  std::mutex::mutex((mutex *)local_198);
  __first = std::
            vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
            ::begin((vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
                     *)local_70);
  __last = std::
           vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
           ::end((vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
                  *)local_70);
  __f.mutex = (mutex *)local_198;
  __f.status = (SearchStatus *)((long)&exploredSubtrees.super___atomic_base<unsigned_long>._M_i + 4)
  ;
  __f.solution = (Packing2D *)((long)&mutex.super___mutex_base._M_mutex + 0x20);
  __f.isFeasible = (atomic<bool> *)&solution.field_0x9f;
  __f.exploredNodes = (atomic<long> *)&stack0xffffffffffffff38;
  __f.exploredSubtrees = (atomic<unsigned_long> *)&exploredNodes;
  __f.this = this;
  __f.endLast = &local_48;
  __f.begin = &local_38;
  std::
  for_each<__pstl::execution::v1::parallel_unsequenced_policy_const&,__gnu_cxx::__normal_iterator<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>*,std::vector<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>,std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>>>>,tsbp::LeftmostActiveOnly::SolveParallelNative()::__0>
            ((parallel_unsequenced_policy *)&__pstl::execution::v1::par_unseq,
             (__normal_iterator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_*,_std::vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_*,_std::vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>_>
              )__last._M_current,__f);
  if (exploredSubtrees.super___atomic_base<unsigned_long>._M_i._4_4_ == Abort) {
    std::operator<<((ostream *)&std::cout,"Search was aborted.\n");
  }
  else {
    bVar2 = std::atomic<bool>::load((atomic<bool> *)&solution.field_0x9f,seq_cst);
    if (bVar2) {
      Packing2D::operator=
                (&this->solution,
                 (Packing2D *)&mutex.super___mutex_base._M_mutex.__data.__list.__next);
      exploredSubtrees.super___atomic_base<unsigned_long>._M_i._4_4_ = Feasible;
      std::operator<<((ostream *)&std::cout,"Feasible solution found.\n");
    }
    else {
      exploredSubtrees.super___atomic_base<unsigned_long>._M_i._4_4_ = Infeasible;
      std::operator<<((ostream *)&std::cout,"Problem is infeasible.\n");
    }
    local_200.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    poVar5 = std::operator<<((ostream *)&std::cout,"Elapsed time until after for_each() = ");
    local_218 = std::
                atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                ::load(&local_38,seq_cst);
    local_210.__r = (rep)std::chrono::operator-(&local_200,&local_218);
    local_208.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                        (&local_210);
    rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_208);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar6);
    std::operator<<(poVar5,"s\n");
    poVar5 = std::operator<<((ostream *)&std::cout,"Termination delay = ");
    local_230 = std::
                atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                ::load(&local_48,seq_cst);
    local_228.__r = (rep)std::chrono::operator-(&local_200,&local_230);
    local_220.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                        (&local_228);
    rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_220);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar6);
    std::operator<<(poVar5,"s\n");
    std::operator&(seq_cst,__memory_order_mask);
    CLI::std::__cxx11::to_string(&local_290,_Stack_c8._M_i);
    std::operator+(&local_270,"Total explored nodes = ",&local_290);
    std::operator+(&local_250,&local_270,"\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
  }
  SVar1 = exploredSubtrees.super___atomic_base<unsigned_long>._M_i._4_4_;
  endParallelFor.__d.__r._4_4_ = 1;
  Packing2D::~Packing2D((Packing2D *)&mutex.super___mutex_base._M_mutex.__data.__list.__next);
  std::
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ::~vector((vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
             *)local_70);
  return SVar1;
}

Assistant:

SearchStatus LeftmostActiveOnly::SolveParallelNative()
{
    std::atomic<std::chrono::steady_clock::time_point> begin = std::chrono::steady_clock::now();
    std::atomic<std::chrono::steady_clock::time_point> endLast = begin.load();

    std::atomic<bool> feasibleSolutionCancellationToken = false;

    std::vector<std::unique_ptr<LeftmostActiveOnly>> subtrees;
    subtrees.reserve(items.size());
    ////for (size_t i = 0; i < 1; i++)
    for (size_t itemId: this->branchingOrder)
    {
        std::unique_ptr<LeftmostActiveOnly> lmao = std::make_unique<LeftmostActiveOnly>(this->parameters);
        lmao->AddContainer(container);
        lmao->AddItems(items, itemId, this->fixedItemCoordinatesX);
        lmao->SetBranchingOrder(this->branchingOrder);
        lmao->AddCancellationToken(&feasibleSolutionCancellationToken); // Optional: comment out for sequential mode.
        ////lmao->AddFixedItem(fixedItem);

        subtrees.push_back(std::move(lmao));
    }

    SearchStatus status = SearchStatus::None;

    std::atomic<size_t> exploredSubtrees(0);
    std::atomic<int64_t> exploredNodes(0);
    std::atomic<bool> isFeasible(false);
    Packing2D solution;

    std::mutex mutex;

    std::for_each(
        std::execution::par_unseq,
        subtrees.begin(),
        subtrees.end(),
        [&](std::unique_ptr<LeftmostActiveOnly>& lmao)
        {
            SearchStatus localStatus = lmao->SolveSequential();
            if (localStatus == SearchStatus::Abort)
            {
                status = localStatus;
            }

            if (localStatus == SearchStatus::Feasible)
            {
                mutex.lock();
                solution = lmao->GetSolution();
                mutex.unlock();

                isFeasible.store(true);
            }

            exploredNodes += lmao->GetTreeSize();
            exploredSubtrees++;

            std::cout << "Explored subtrees = " + std::to_string(exploredSubtrees) + " / " + std::to_string(items.size()) + "\n";

            std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();
            endLast = end;
            std::cout << "Elapsed time = " << std::chrono::duration_cast<std::chrono::seconds>(end - begin.load()).count() << "s\n";

            lmao.reset();
        });

    if (status == SearchStatus::Abort)
    {
        std::cout << "Search was aborted.\n";
        return status;
    }

    if (isFeasible.load())
    {
        this->solution = solution;
        status = SearchStatus::Feasible;
        std::cout << "Feasible solution found.\n";
    }
    else
    {
        status = SearchStatus::Infeasible;
        std::cout << "Problem is infeasible.\n";
    }

    std::chrono::steady_clock::time_point endParallelFor = std::chrono::steady_clock::now();

    std::cout << "Elapsed time until after for_each() = " << std::chrono::duration_cast<std::chrono::seconds>(endParallelFor - begin.load()).count() << "s\n";
    std::cout << "Termination delay = " << std::chrono::duration_cast<std::chrono::seconds>(endParallelFor - endLast.load()).count() << "s\n";

    std::cout << "Total explored nodes = " + std::to_string(exploredNodes.load()) + "\n";

    return status;
}